

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Flatten_x86_fma::forward(Flatten_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  void *pvVar10;
  void *pvVar11;
  size_t sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  undefined1 (*pauVar36) [32];
  uint uVar37;
  undefined1 (*pauVar38) [32];
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  undefined4 *puVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  size_t sVar49;
  undefined4 *puVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  
  iVar27 = bottom_blob->elempack;
  uVar40 = (ulong)iVar27;
  if ((uVar40 != 0) && (((int)bottom_blob->elemsize << 3) / iVar27 == 8)) {
    iVar27 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar27;
  }
  iVar32 = bottom_blob->dims;
  if (iVar32 == 1) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar9 = bottom_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar9 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar9;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar27 = bottom_blob->w;
    iVar32 = bottom_blob->h;
    iVar35 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar27;
    top_blob->h = iVar32;
    top_blob->d = iVar35;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  if (opt->use_packing_layout == true) {
    uVar37 = bottom_blob->w;
    lVar46 = (long)(int)uVar37;
    uVar6 = bottom_blob->h;
    uVar7 = bottom_blob->c;
    uVar47 = (ulong)uVar7;
    uVar34 = uVar6 * uVar37 * bottom_blob->d;
    uVar33 = uVar7 * iVar27 * uVar34;
    if ((uVar33 & 7) == 0) {
      sVar49 = bottom_blob->elemsize / uVar40 << 3;
      iVar35 = 8;
    }
    else {
      sVar49 = bottom_blob->elemsize / uVar40 << ((uVar33 & 3) == 0) * '\x02';
      if ((uVar33 & 3) != 0) goto LAB_002a63e9;
      iVar35 = 4;
    }
    if (iVar27 == 1 && iVar32 == 2) {
      if (top_blob != bottom_blob) {
        piVar9 = bottom_blob->refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + 1;
          UNLOCK();
        }
        piVar9 = top_blob->refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar9 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar9;
        top_blob->allocator = bottom_blob->allocator;
        iVar27 = bottom_blob->c;
        top_blob->d = bottom_blob->d;
        top_blob->c = iVar27;
      }
      top_blob->dims = 1;
      top_blob->w = (int)uVar33 / iVar35;
      top_blob->h = 1;
      top_blob->cstep = (long)((int)uVar33 / iVar35);
      top_blob->elemsize = sVar49;
      top_blob->elempack = iVar35;
    }
    else {
      Mat::create(top_blob,(int)uVar33 / iVar35,sVar49,iVar35,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar32 == 2) {
        if (iVar27 == 4) {
          if ((int)uVar6 < 1) {
            return 0;
          }
          lVar43 = lVar46 * 4;
          lVar42 = lVar46 * 0xc;
          lVar41 = lVar46 * 0x10;
          lVar44 = lVar46 * 8;
          iVar35 = 0;
          uVar40 = 0;
          do {
            iVar8 = bottom_blob->w;
            pvVar10 = bottom_blob->data;
            sVar49 = bottom_blob->elemsize;
            puVar50 = (undefined4 *)(uVar40 * (long)iVar8 * sVar49 + (long)pvVar10);
            pvVar11 = top_blob->data;
            if ((int)uVar37 < 4) {
              lVar28 = (long)(int)(uVar37 * 4 * (int)uVar40) * 4;
              lVar48 = (uVar40 * 4 + 1) * lVar46 * 4;
              lVar1 = (uVar40 * 4 + 2) * lVar46 * 4;
              lVar2 = (uVar40 * 4 + 3) * lVar46 * 4;
              uVar33 = 0;
            }
            else {
              iVar31 = 3;
              lVar48 = 0;
              do {
                puVar45 = puVar50;
                puVar50 = (undefined4 *)
                          ((long)pvVar10 + lVar48 * 4 + 0x40 + sVar49 * uVar40 * (long)iVar8);
                auVar22 = vunpcklps_avx(*(undefined1 (*) [16])(puVar50 + -0x10),
                                        *(undefined1 (*) [16])(puVar50 + -0xc));
                auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(puVar50 + -8),
                                        *(undefined1 (*) [16])(puVar50 + -4));
                auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(puVar50 + -0x10),
                                        *(undefined1 (*) [16])(puVar50 + -0xc));
                auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(puVar50 + -8),
                                        *(undefined1 (*) [16])(puVar50 + -4));
                auVar13 = vmovlhps_avx(auVar22,auVar23);
                auVar23 = vunpckhpd_avx(auVar22,auVar23);
                auVar22 = vmovlhps_avx(auVar14,auVar15);
                auVar14 = vunpckhpd_avx(auVar14,auVar15);
                *(undefined1 (*) [16])((long)pvVar11 + lVar48 + (long)iVar35 * 4) = auVar13;
                *(undefined1 (*) [16])((long)pvVar11 + lVar48 + lVar43) = auVar23;
                *(undefined1 (*) [16])((long)pvVar11 + lVar48 + lVar44) = auVar22;
                *(undefined1 (*) [16])((long)pvVar11 + lVar48 + lVar42) = auVar14;
                lVar48 = lVar48 + 0x10;
                iVar31 = iVar31 + 4;
              } while (iVar31 < (int)uVar37);
              puVar50 = puVar45 + 0x10;
              lVar28 = lVar48 + (long)iVar35 * 4;
              lVar2 = lVar48 + lVar42;
              lVar1 = lVar48 + lVar44;
              lVar48 = lVar48 + lVar43;
              uVar33 = uVar37 & 0xfffffffc;
            }
            if ((int)uVar33 < (int)uVar37) {
              lVar39 = 0;
              do {
                *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar28) = *puVar50;
                *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar48) = puVar50[1];
                *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar1) = puVar50[2];
                *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar2) = puVar50[3];
                puVar50 = puVar50 + 4;
                lVar39 = lVar39 + 1;
              } while (uVar37 - uVar33 != (int)lVar39);
            }
            uVar40 = uVar40 + 1;
            iVar35 = iVar35 + uVar37 * 4;
            lVar42 = lVar42 + lVar41;
            lVar44 = lVar44 + lVar41;
            lVar43 = lVar43 + lVar41;
          } while (uVar40 != uVar6);
        }
        else {
          if (iVar27 != 8) {
            return 0;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          lVar43 = lVar46 * 4;
          lVar28 = lVar46 * 0x20;
          lVar44 = lVar46 * 8;
          lVar42 = lVar46 * 0xc;
          local_70 = lVar46 << 4;
          local_78 = lVar46 * 0x14;
          local_80 = lVar46 * 0x18;
          local_88 = lVar46 * 0x1c;
          iVar35 = 0;
          uVar40 = 0;
          lVar41 = lVar43;
          do {
            iVar8 = bottom_blob->w;
            pvVar10 = bottom_blob->data;
            sVar49 = bottom_blob->elemsize;
            pauVar38 = (undefined1 (*) [32])(uVar40 * (long)iVar8 * sVar49 + (long)pvVar10);
            pvVar11 = top_blob->data;
            if ((int)uVar37 < 8) {
              lVar48 = (long)(int)(uVar37 * 8 * (int)uVar40) * 4;
              lVar1 = (uVar40 * 8 + 1) * lVar46 * 4;
              lVar2 = (uVar40 * 8 + 2) * lVar46 * 4;
              lVar39 = (uVar40 * 8 + 3) * lVar46 * 4;
              lVar3 = (uVar40 * 8 + 4) * lVar46 * 4;
              lVar4 = (uVar40 * 8 + 5) * lVar46 * 4;
              lVar5 = (uVar40 * 8 + 6) * lVar46 * 4;
              lVar29 = (uVar40 * 8 + 7) * lVar46 * 4;
              uVar33 = 0;
            }
            else {
              iVar31 = 7;
              lVar29 = 0;
              do {
                pauVar36 = pauVar38;
                pauVar38 = (undefined1 (*) [32])
                           ((long)pvVar10 + lVar29 * 8 + sVar49 * uVar40 * (long)iVar8);
                auVar24 = vunpcklps_avx(*pauVar38,pauVar38[1]);
                auVar16 = vunpckhps_avx(*pauVar38,pauVar38[1]);
                auVar25 = vunpcklps_avx(pauVar38[2],pauVar38[3]);
                auVar17 = vunpckhps_avx(pauVar38[2],pauVar38[3]);
                auVar26 = vunpcklps_avx(pauVar38[4],pauVar38[5]);
                auVar18 = vunpckhps_avx(pauVar38[4],pauVar38[5]);
                auVar51 = vunpcklps_avx(pauVar38[6],pauVar38[7]);
                auVar19 = vunpckhps_avx(pauVar38[6],pauVar38[7]);
                auVar20 = vunpcklpd_avx(auVar24,auVar25);
                auVar24 = vunpckhpd_avx(auVar24,auVar25);
                auVar25 = vunpcklpd_avx(auVar16,auVar17);
                auVar16 = vunpckhpd_avx(auVar16,auVar17);
                auVar21 = vunpcklpd_avx(auVar26,auVar51);
                auVar17 = vunpckhpd_avx(auVar26,auVar51);
                auVar26 = vunpcklpd_avx(auVar18,auVar19);
                auVar18 = vunpckhpd_avx(auVar18,auVar19);
                auVar51._16_16_ = auVar21._0_16_;
                auVar51._0_16_ = auVar20._0_16_;
                auVar53._16_16_ = auVar17._0_16_;
                auVar53._0_16_ = auVar24._0_16_;
                auVar55._16_16_ = auVar26._0_16_;
                auVar55._0_16_ = auVar25._0_16_;
                auVar57._16_16_ = auVar18._0_16_;
                auVar57._0_16_ = auVar16._0_16_;
                auVar19 = vperm2f128_avx(auVar20,auVar21,0x31);
                auVar24 = vperm2f128_avx(auVar24,auVar17,0x31);
                auVar17 = vperm2f128_avx(auVar25,auVar26,0x31);
                auVar16 = vperm2f128_avx(auVar16,auVar18,0x31);
                *(undefined1 (*) [32])((long)pvVar11 + lVar29 + (long)iVar35 * 4) = auVar51;
                *(undefined1 (*) [32])((long)pvVar11 + lVar29 + lVar41) = auVar53;
                *(undefined1 (*) [32])((long)pvVar11 + lVar43 + lVar29 + lVar41) = auVar55;
                lVar48 = lVar43 + lVar29 + lVar41;
                *(undefined1 (*) [32])((long)pvVar11 + lVar43 + lVar48) = auVar57;
                lVar48 = lVar43 + lVar48;
                *(undefined1 (*) [32])((long)pvVar11 + lVar43 + lVar48) = auVar19;
                lVar48 = lVar43 + lVar48;
                *(undefined1 (*) [32])((long)pvVar11 + lVar43 + lVar48) = auVar24;
                lVar48 = lVar43 + lVar48;
                *(undefined1 (*) [32])((long)pvVar11 + lVar43 + lVar48) = auVar17;
                *(undefined1 (*) [32])((long)pvVar11 + lVar46 * 8 + lVar48) = auVar16;
                lVar29 = lVar29 + 0x20;
                iVar31 = iVar31 + 8;
                pauVar38 = pauVar38 + 8;
              } while (iVar31 < (int)uVar37);
              pauVar38 = pauVar36 + 8;
              lVar48 = lVar29 + (long)iVar35 * 4;
              lVar1 = lVar29 + lVar41;
              lVar2 = lVar29 + lVar44;
              lVar39 = lVar29 + lVar42;
              lVar3 = lVar29 + local_70;
              lVar4 = lVar29 + local_78;
              lVar5 = lVar29 + local_80;
              lVar29 = lVar29 + local_88;
              uVar33 = uVar37 & 0xfffffff8;
            }
            if ((int)uVar33 < (int)uVar37) {
              lVar30 = 0;
              do {
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar48) = *(undefined4 *)*pauVar38;
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar1) = *(undefined4 *)(*pauVar38 + 4)
                ;
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar2) = *(undefined4 *)(*pauVar38 + 8)
                ;
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar39) =
                     *(undefined4 *)(*pauVar38 + 0xc);
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar3) =
                     *(undefined4 *)(*pauVar38 + 0x10);
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar4) =
                     *(undefined4 *)(*pauVar38 + 0x14);
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar5) =
                     *(undefined4 *)(*pauVar38 + 0x18);
                *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar29) =
                     *(undefined4 *)(*pauVar38 + 0x1c);
                pauVar38 = pauVar38 + 1;
                lVar30 = lVar30 + 1;
              } while (uVar37 - uVar33 != (int)lVar30);
            }
            uVar40 = uVar40 + 1;
            iVar35 = iVar35 + uVar37 * 8;
            lVar41 = lVar41 + lVar28;
            lVar44 = lVar44 + lVar28;
            lVar42 = lVar42 + lVar28;
            local_70 = local_70 + lVar28;
            local_78 = local_78 + lVar28;
            local_80 = local_80 + lVar28;
            local_88 = local_88 + lVar28;
          } while (uVar40 != uVar6);
        }
      }
      if (1 < iVar32 - 3U) {
        return 0;
      }
      if (iVar27 == 4) {
        if ((int)uVar7 < 1) {
          return 0;
        }
        lVar42 = (long)(int)uVar34;
        lVar46 = lVar42 * 4;
        lVar44 = lVar42 * 0xc;
        lVar41 = lVar42 * 0x10;
        lVar43 = lVar42 * 8;
        iVar32 = 0;
        uVar40 = 0;
        do {
          sVar49 = bottom_blob->cstep;
          pvVar10 = bottom_blob->data;
          sVar12 = bottom_blob->elemsize;
          puVar50 = (undefined4 *)(sVar49 * uVar40 * sVar12 + (long)pvVar10);
          pvVar11 = top_blob->data;
          if ((int)uVar34 < 4) {
            lVar28 = (long)(int)(uVar34 * 4 * (int)uVar40) * 4;
            lVar48 = (uVar40 * 4 + 1) * lVar42 * 4;
            lVar1 = (uVar40 * 4 + 2) * lVar42 * 4;
            lVar2 = (uVar40 * 4 + 3) * lVar42 * 4;
            uVar37 = 0;
          }
          else {
            iVar35 = 3;
            lVar28 = 0;
            do {
              puVar45 = puVar50;
              puVar50 = (undefined4 *)((long)pvVar10 + lVar28 * 4 + 0x40 + sVar49 * sVar12 * uVar40)
              ;
              auVar22 = vunpcklps_avx(*(undefined1 (*) [16])(puVar50 + -0x10),
                                      *(undefined1 (*) [16])(puVar50 + -0xc));
              auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(puVar50 + -8),
                                      *(undefined1 (*) [16])(puVar50 + -4));
              auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(puVar50 + -0x10),
                                      *(undefined1 (*) [16])(puVar50 + -0xc));
              auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(puVar50 + -8),
                                      *(undefined1 (*) [16])(puVar50 + -4));
              auVar13 = vmovlhps_avx(auVar22,auVar23);
              auVar23 = vunpckhpd_avx(auVar22,auVar23);
              auVar22 = vmovlhps_avx(auVar14,auVar15);
              auVar14 = vunpckhpd_avx(auVar14,auVar15);
              *(undefined1 (*) [16])((long)pvVar11 + lVar28 + (long)iVar32 * 4) = auVar13;
              *(undefined1 (*) [16])((long)pvVar11 + lVar28 + lVar46) = auVar23;
              *(undefined1 (*) [16])((long)pvVar11 + lVar28 + lVar43) = auVar22;
              *(undefined1 (*) [16])((long)pvVar11 + lVar28 + lVar44) = auVar14;
              iVar35 = iVar35 + 4;
              lVar28 = lVar28 + 0x10;
            } while (iVar35 < (int)uVar34);
            puVar50 = puVar45 + 0x10;
            lVar2 = lVar28 + lVar44;
            lVar1 = lVar28 + lVar43;
            lVar48 = lVar28 + lVar46;
            lVar28 = lVar28 + (long)iVar32 * 4;
            uVar37 = uVar34 & 0xfffffffc;
          }
          if ((int)uVar37 < (int)uVar34) {
            lVar39 = 0;
            do {
              *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar28) = *puVar50;
              *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar48) = puVar50[1];
              *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar1) = puVar50[2];
              *(undefined4 *)((long)pvVar11 + lVar39 * 4 + lVar2) = puVar50[3];
              puVar50 = puVar50 + 4;
              lVar39 = lVar39 + 1;
            } while (uVar34 - uVar37 != (int)lVar39);
          }
          uVar40 = uVar40 + 1;
          lVar44 = lVar44 + lVar41;
          lVar43 = lVar43 + lVar41;
          lVar46 = lVar46 + lVar41;
          iVar32 = iVar32 + uVar34 * 4;
        } while (uVar40 != uVar47);
      }
      else if (iVar27 == 8) {
        if ((int)uVar7 < 1) {
          return 0;
        }
        lVar28 = (long)(int)uVar34;
        lVar42 = lVar28 * 0x1c;
        lVar41 = lVar28 * 0x20;
        lVar46 = lVar28 * 8;
        lVar43 = lVar28 * 0x18;
        local_70 = lVar28 * 4;
        lVar44 = lVar28 * 0x14;
        local_78 = lVar28 << 4;
        local_80 = lVar28 * 0xc;
        iVar32 = 0;
        uVar40 = 0;
        do {
          sVar49 = bottom_blob->cstep;
          pvVar10 = bottom_blob->data;
          sVar12 = bottom_blob->elemsize;
          pauVar38 = (undefined1 (*) [32])(sVar49 * uVar40 * sVar12 + (long)pvVar10);
          pvVar11 = top_blob->data;
          if ((int)uVar34 < 8) {
            lVar48 = (long)(int)(uVar34 * 8 * (int)uVar40) * 4;
            lVar1 = (uVar40 * 8 + 1) * lVar28 * 4;
            lVar2 = (uVar40 * 8 + 2) * lVar28 * 4;
            lVar39 = (uVar40 * 8 + 3) * lVar28 * 4;
            lVar3 = (uVar40 * 8 + 4) * lVar28 * 4;
            lVar4 = (uVar40 * 8 + 5) * lVar28 * 4;
            lVar5 = (uVar40 * 8 + 6) * lVar28 * 4;
            lVar29 = (uVar40 * 8 + 7) * lVar28 * 4;
            uVar37 = 0;
          }
          else {
            iVar35 = 7;
            lVar48 = 0;
            do {
              pauVar36 = pauVar38;
              pauVar38 = (undefined1 (*) [32])
                         ((long)pvVar10 + lVar48 * 8 + sVar49 * sVar12 * uVar40);
              auVar24 = vunpcklps_avx(*pauVar38,pauVar38[1]);
              auVar16 = vunpckhps_avx(*pauVar38,pauVar38[1]);
              auVar25 = vunpcklps_avx(pauVar38[2],pauVar38[3]);
              auVar17 = vunpckhps_avx(pauVar38[2],pauVar38[3]);
              auVar26 = vunpcklps_avx(pauVar38[4],pauVar38[5]);
              auVar18 = vunpckhps_avx(pauVar38[4],pauVar38[5]);
              auVar51 = vunpcklps_avx(pauVar38[6],pauVar38[7]);
              auVar19 = vunpckhps_avx(pauVar38[6],pauVar38[7]);
              auVar20 = vunpcklpd_avx(auVar24,auVar25);
              auVar24 = vunpckhpd_avx(auVar24,auVar25);
              auVar25 = vunpcklpd_avx(auVar16,auVar17);
              auVar16 = vunpckhpd_avx(auVar16,auVar17);
              auVar21 = vunpcklpd_avx(auVar26,auVar51);
              auVar17 = vunpckhpd_avx(auVar26,auVar51);
              auVar26 = vunpcklpd_avx(auVar18,auVar19);
              auVar18 = vunpckhpd_avx(auVar18,auVar19);
              auVar52._16_16_ = auVar21._0_16_;
              auVar52._0_16_ = auVar20._0_16_;
              auVar54._16_16_ = auVar17._0_16_;
              auVar54._0_16_ = auVar24._0_16_;
              auVar56._16_16_ = auVar26._0_16_;
              auVar56._0_16_ = auVar25._0_16_;
              auVar58._16_16_ = auVar18._0_16_;
              auVar58._0_16_ = auVar16._0_16_;
              auVar19 = vperm2f128_avx(auVar20,auVar21,0x31);
              auVar24 = vperm2f128_avx(auVar24,auVar17,0x31);
              auVar17 = vperm2f128_avx(auVar25,auVar26,0x31);
              auVar16 = vperm2f128_avx(auVar16,auVar18,0x31);
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + (long)iVar32 * 4) = auVar52;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + local_70) = auVar54;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + lVar46) = auVar56;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + local_80) = auVar58;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + local_78) = auVar19;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + lVar44) = auVar24;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + lVar43) = auVar17;
              *(undefined1 (*) [32])((long)pvVar11 + lVar48 + lVar42) = auVar16;
              iVar35 = iVar35 + 8;
              lVar48 = lVar48 + 0x20;
              pauVar38 = pauVar38 + 8;
            } while (iVar35 < (int)uVar34);
            pauVar38 = pauVar36 + 8;
            lVar29 = lVar48 + lVar42;
            lVar5 = lVar48 + lVar43;
            lVar4 = lVar48 + lVar44;
            lVar3 = lVar48 + local_78;
            lVar39 = lVar48 + local_80;
            lVar2 = lVar48 + lVar46;
            lVar1 = lVar48 + local_70;
            lVar48 = lVar48 + (long)iVar32 * 4;
            uVar37 = uVar34 & 0xfffffff8;
          }
          if ((int)uVar37 < (int)uVar34) {
            lVar30 = 0;
            do {
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar48) = *(undefined4 *)*pauVar38;
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar1) = *(undefined4 *)(*pauVar38 + 4);
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar2) = *(undefined4 *)(*pauVar38 + 8);
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar39) =
                   *(undefined4 *)(*pauVar38 + 0xc);
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar3) =
                   *(undefined4 *)(*pauVar38 + 0x10);
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar4) =
                   *(undefined4 *)(*pauVar38 + 0x14);
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar5) =
                   *(undefined4 *)(*pauVar38 + 0x18);
              *(undefined4 *)((long)pvVar11 + lVar30 * 4 + lVar29) =
                   *(undefined4 *)(*pauVar38 + 0x1c);
              pauVar38 = pauVar38 + 1;
              lVar30 = lVar30 + 1;
            } while (uVar34 - uVar37 != (int)lVar30);
          }
          uVar40 = uVar40 + 1;
          lVar42 = lVar42 + lVar41;
          lVar43 = lVar43 + lVar41;
          lVar44 = lVar44 + lVar41;
          local_78 = local_78 + lVar41;
          local_80 = local_80 + lVar41;
          lVar46 = lVar46 + lVar41;
          local_70 = local_70 + lVar41;
          iVar32 = iVar32 + uVar34 * 8;
        } while (uVar40 != uVar47);
      }
      if (0 < (int)uVar7 && iVar27 == 1) {
        uVar40 = 0;
        do {
          pauVar38 = (undefined1 (*) [32])
                     (bottom_blob->cstep * uVar40 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar36 = (undefined1 (*) [32])(uVar40 * (long)(int)uVar34 * 4 + (long)top_blob->data);
          if ((int)uVar34 < 8) {
            uVar37 = 0;
          }
          else {
            iVar27 = 7;
            do {
              *pauVar36 = *pauVar38;
              pauVar38 = pauVar38 + 1;
              pauVar36 = pauVar36 + 1;
              iVar27 = iVar27 + 8;
              uVar37 = uVar34 & 0xfffffff8;
            } while (iVar27 < (int)uVar34);
          }
          if ((int)uVar37 < (int)uVar34) {
            lVar46 = 0;
            do {
              *(undefined4 *)(*pauVar36 + lVar46 * 4) = *(undefined4 *)(*pauVar38 + lVar46 * 4);
              lVar46 = lVar46 + 1;
            } while (uVar34 - uVar37 != (int)lVar46);
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 != uVar47);
      }
    }
    return 0;
  }
LAB_002a63e9:
  iVar27 = Flatten::forward(&this->super_Flatten,bottom_blob,top_blob,opt);
  return iVar27;
}

Assistant:

int Flatten_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = total % 16 == 0 ? 16 : total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 16;
                float* outptr1 = (float*)top_blob + w * (i * 16 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 16 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 16 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 16 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 16 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 16 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 16 + 7);
                float* outptr8 = (float*)top_blob + w * (i * 16 + 8);
                float* outptr9 = (float*)top_blob + w * (i * 16 + 9);
                float* outptra = (float*)top_blob + w * (i * 16 + 10);
                float* outptrb = (float*)top_blob + w * (i * 16 + 11);
                float* outptrc = (float*)top_blob + w * (i * 16 + 12);
                float* outptrd = (float*)top_blob + w * (i * 16 + 13);
                float* outptre = (float*)top_blob + w * (i * 16 + 14);
                float* outptrf = (float*)top_blob + w * (i * 16 + 15);

                int j = 0;
                for (; j + 15 < w; j += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 16;
                float* outptr1 = (float*)top_blob + size * (q * 16 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 16 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 16 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 16 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 16 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 16 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 16 + 7);
                float* outptr8 = (float*)top_blob + size * (q * 16 + 8);
                float* outptr9 = (float*)top_blob + size * (q * 16 + 9);
                float* outptra = (float*)top_blob + size * (q * 16 + 10);
                float* outptrb = (float*)top_blob + size * (q * 16 + 11);
                float* outptrc = (float*)top_blob + size * (q * 16 + 12);
                float* outptrd = (float*)top_blob + size * (q * 16 + 13);
                float* outptre = (float*)top_blob + size * (q * 16 + 14);
                float* outptrf = (float*)top_blob + size * (q * 16 + 15);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}